

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::ProcessStructuredBlock(MergeReturnPass *this,BasicBlock *block)

{
  BasicBlock *block_00;
  bool bVar1;
  uint32_t target;
  Instruction *this_00;
  StructuredControlState *pSVar2;
  uint32_t local_2c;
  undefined1 local_28 [20];
  Op tail_opcode;
  BasicBlock *block_local;
  MergeReturnPass *this_local;
  
  unique0x10000145 = block;
  block_local = (BasicBlock *)this;
  BasicBlock::tail((BasicBlock *)local_28);
  this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
            iterator_template<spvtools::opt::Instruction>::operator->
                      ((iterator_template<spvtools::opt::Instruction> *)local_28);
  local_28._12_4_ = opt::Instruction::opcode(this_00);
  if (((local_28._12_4_ == OpReturn) || (local_28._12_4_ == OpReturnValue)) &&
     (this->return_flag_ == (Instruction *)0x0)) {
    AddReturnFlag(this);
  }
  if (((local_28._12_4_ == OpReturn) || (local_28._12_4_ == OpReturnValue)) ||
     (local_28._12_4_ == OpUnreachable)) {
    pSVar2 = CurrentState(this);
    bVar1 = StructuredControlState::InBreakable(pSVar2);
    block_00 = stack0xffffffffffffffe8;
    if (!bVar1) {
      __assert_fail("CurrentState().InBreakable() && \"Should be in the placeholder construct.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0xea,
                    "void spvtools::opt::MergeReturnPass::ProcessStructuredBlock(BasicBlock *)");
    }
    pSVar2 = CurrentState(this);
    target = StructuredControlState::BreakMergeId(pSVar2);
    BranchToBlock(this,block_00,target);
    local_2c = BasicBlock::id(stack0xffffffffffffffe8);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&this->return_blocks_,&local_2c);
  }
  return;
}

Assistant:

void MergeReturnPass::ProcessStructuredBlock(BasicBlock* block) {
  spv::Op tail_opcode = block->tail()->opcode();
  if (tail_opcode == spv::Op::OpReturn ||
      tail_opcode == spv::Op::OpReturnValue) {
    if (!return_flag_) {
      AddReturnFlag();
    }
  }

  if (tail_opcode == spv::Op::OpReturn ||
      tail_opcode == spv::Op::OpReturnValue ||
      tail_opcode == spv::Op::OpUnreachable) {
    assert(CurrentState().InBreakable() &&
           "Should be in the placeholder construct.");
    BranchToBlock(block, CurrentState().BreakMergeId());
    return_blocks_.insert(block->id());
  }
}